

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O0

void tree_to_node(void *data,BLOCK_SIZE bsize,variance_node *node)

{
  int split_idx_5;
  VP4x4 *vt_5;
  int split_idx_4;
  VP8x8 *vt_4;
  int split_idx_3;
  VP16x16 *vt_3;
  int split_idx_2;
  VP32x32 *vt_2;
  int split_idx_1;
  VP64x64 *vt_1;
  int split_idx;
  VP128x128 *vt;
  variance_node *node_local;
  BLOCK_SIZE bsize_local;
  void *data_local;
  
  node->part_variances = (VPVariance *)0x0;
  switch(bsize) {
  case BLOCK_8X8:
    node->part_variances = (VPVariance *)data;
    for (split_idx_4 = 0; split_idx_4 < 4; split_idx_4 = split_idx_4 + 1) {
      node->split[split_idx_4] = (VPartVar *)((long)data + (long)split_idx_4 * 0x90 + 0x50);
    }
    break;
  default:
    node->part_variances = (VPVariance *)data;
    for (split_idx_5 = 0; split_idx_5 < 4; split_idx_5 = split_idx_5 + 1) {
      node->split[split_idx_5] = (VPartVar *)((long)data + (long)split_idx_5 * 0x10 + 0x50);
    }
    break;
  case BLOCK_16X16:
    node->part_variances = (VPVariance *)data;
    for (split_idx_3 = 0; split_idx_3 < 4; split_idx_3 = split_idx_3 + 1) {
      node->split[split_idx_3] = (VPartVar *)((long)data + (long)split_idx_3 * 0x290 + 0x50);
    }
    break;
  case BLOCK_32X32:
    node->part_variances = (VPVariance *)data;
    for (split_idx_2 = 0; split_idx_2 < 4; split_idx_2 = split_idx_2 + 1) {
      node->split[split_idx_2] = (VPartVar *)((long)data + (long)split_idx_2 * 0xa90 + 0x50);
    }
    break;
  case BLOCK_64X64:
    node->part_variances = (VPVariance *)data;
    for (split_idx_1 = 0; split_idx_1 < 4; split_idx_1 = split_idx_1 + 1) {
      node->split[split_idx_1] = (VPartVar *)((long)data + (long)split_idx_1 * 0x2a90 + 0x50);
    }
    break;
  case BLOCK_128X128:
    node->part_variances = (VPVariance *)data;
    for (split_idx = 0; split_idx < 4; split_idx = split_idx + 1) {
      node->split[split_idx] = (VPartVar *)(*(long *)((long)data + 0x50) + (long)split_idx * 0xaa90)
      ;
    }
  }
  return;
}

Assistant:

static inline void tree_to_node(void *data, BLOCK_SIZE bsize,
                                variance_node *node) {
  node->part_variances = NULL;
  switch (bsize) {
    case BLOCK_128X128: {
      VP128x128 *vt = (VP128x128 *)data;
      node->part_variances = &vt->part_variances;
      for (int split_idx = 0; split_idx < 4; split_idx++)
        node->split[split_idx] = &vt->split[split_idx].part_variances.none;
      break;
    }
    case BLOCK_64X64: {
      VP64x64 *vt = (VP64x64 *)data;
      node->part_variances = &vt->part_variances;
      for (int split_idx = 0; split_idx < 4; split_idx++)
        node->split[split_idx] = &vt->split[split_idx].part_variances.none;
      break;
    }
    case BLOCK_32X32: {
      VP32x32 *vt = (VP32x32 *)data;
      node->part_variances = &vt->part_variances;
      for (int split_idx = 0; split_idx < 4; split_idx++)
        node->split[split_idx] = &vt->split[split_idx].part_variances.none;
      break;
    }
    case BLOCK_16X16: {
      VP16x16 *vt = (VP16x16 *)data;
      node->part_variances = &vt->part_variances;
      for (int split_idx = 0; split_idx < 4; split_idx++)
        node->split[split_idx] = &vt->split[split_idx].part_variances.none;
      break;
    }
    case BLOCK_8X8: {
      VP8x8 *vt = (VP8x8 *)data;
      node->part_variances = &vt->part_variances;
      for (int split_idx = 0; split_idx < 4; split_idx++)
        node->split[split_idx] = &vt->split[split_idx].part_variances.none;
      break;
    }
    default: {
      VP4x4 *vt = (VP4x4 *)data;
      assert(bsize == BLOCK_4X4);
      node->part_variances = &vt->part_variances;
      for (int split_idx = 0; split_idx < 4; split_idx++)
        node->split[split_idx] = &vt->split[split_idx];
      break;
    }
  }
}